

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_fence_release(ma_fence *pFence)

{
  ma_uint32 mVar1;
  ma_uint32 mVar2;
  ma_result in_ECX;
  bool bVar3;
  
  if (pFence == (ma_fence *)0x0) {
    in_ECX = MA_INVALID_ARGS;
  }
  else {
    do {
      mVar1 = pFence->counter;
      if (mVar1 == 0) {
        bVar3 = false;
        in_ECX = MA_INVALID_OPERATION;
      }
      else {
        LOCK();
        mVar2 = pFence->counter;
        bVar3 = mVar1 == mVar2;
        if (bVar3) {
          pFence->counter = mVar1 - 1;
          mVar2 = mVar1;
        }
        UNLOCK();
        if (mVar2 == 0) {
          in_ECX = MA_INVALID_OPERATION;
        }
        if (bVar3) {
          in_ECX = MA_SUCCESS;
        }
        bVar3 = mVar2 != 0 && !bVar3;
      }
    } while (bVar3);
  }
  return in_ECX;
}

Assistant:

MA_API ma_result ma_fence_release(ma_fence* pFence)
{
    if (pFence == NULL) {
        return MA_INVALID_ARGS;
    }

    for (;;) {
        ma_uint32 oldCounter = ma_atomic_load_32(&pFence->counter);
        ma_uint32 newCounter = oldCounter - 1;

        if (oldCounter == 0) {
            MA_ASSERT(MA_FALSE);
            return MA_INVALID_OPERATION;    /* Acquire/release mismatch. */
        }

        if (ma_atomic_compare_exchange_weak_32(&pFence->counter, &oldCounter, newCounter)) {
            #ifndef MA_NO_THREADING
            {
                if (newCounter == 0) {
                    ma_event_signal(&pFence->e);    /* <-- ma_fence_wait() will be waiting on this. */
                }
            }
            #endif

            return MA_SUCCESS;
        } else {
            if (oldCounter == 0) {
                MA_ASSERT(MA_FALSE);
                return MA_INVALID_OPERATION;    /* Another thread has taken the 0 slot. Acquire/release mismatch. */
            }
        }
    }

    /* Should never get here. */
    /*return MA_SUCCESS;*/
}